

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O0

void __thiscall
QOpenGLExtensionsPrivate::QOpenGLExtensionsPrivate
          (QOpenGLExtensionsPrivate *this,QOpenGLContext *ctx)

{
  _func_void_ptr_uint_uint *p_Var1;
  _func_void_uint_long_long_void_ptr *p_Var2;
  _func_void_uint_int_uint_ptr *p_Var3;
  QOpenGLExtraFunctionsPrivate *in_RDI;
  QOpenGLContext *context;
  QOpenGLContext *in_stack_ffffffffffffffd8;
  
  QOpenGLExtraFunctionsPrivate::QOpenGLExtraFunctionsPrivate(in_RDI,in_stack_ffffffffffffffd8);
  *(undefined1 *)((long)&in_RDI[1].super_QOpenGLFunctionsPrivate.field_0 + 0x18) = 0;
  QOpenGLContext::currentContext();
  p_Var1 = ___anonymous_namespace___resolve<void*(*)(unsigned_int,unsigned_int)>_QOpenGLContext__char_const__void_____unsigned_int_unsigned_int___
                     ((QOpenGLContext *)in_RDI,(char *)in_stack_ffffffffffffffd8,
                      (_func_void_ptr_uint_uint *)0x90eebc);
  in_RDI[1].super_QOpenGLFunctionsPrivate.field_0.functions[0] = (QFunctionPointer)p_Var1;
  p_Var2 = ___anonymous_namespace___resolve<void(*)(unsigned_int,long,long,void*)>_QOpenGLContext__char_const__void____unsigned_int_long_long_void____
                     ((QOpenGLContext *)in_RDI,(char *)in_stack_ffffffffffffffd8,
                      (_func_void_uint_long_long_void_ptr *)0x90eee3);
  in_RDI[1].super_QOpenGLFunctionsPrivate.field_0.functions[1] = (QFunctionPointer)p_Var2;
  p_Var3 = ___anonymous_namespace___resolve<void(*)(unsigned_int,int,unsigned_int_const*)>_QOpenGLContext__char_const__void____unsigned_int_int_unsigned_int_const____
                     ((QOpenGLContext *)in_RDI,(char *)in_stack_ffffffffffffffd8,
                      (_func_void_uint_int_uint_ptr *)0x90ef0a);
  in_RDI[1].super_QOpenGLFunctionsPrivate.field_0.functions[2] = (QFunctionPointer)p_Var3;
  return;
}

Assistant:

QOpenGLExtensionsPrivate::QOpenGLExtensionsPrivate(QOpenGLContext *ctx)
    : QOpenGLExtraFunctionsPrivate(ctx),
      flushVendorChecked(false)
{
    QOpenGLContext *context = QOpenGLContext::currentContext();

    MapBuffer = RESOLVE(MapBuffer);
    GetBufferSubData = RESOLVE(GetBufferSubData);
    DiscardFramebuffer = RESOLVE(DiscardFramebuffer);
}